

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void compute_coherence_metrics<dense_parameters>(lda *l,dense_parameters *weights)

{
  uint64_t uVar1;
  initializer_list<word_doc_frequency> __l;
  bool bVar2;
  size_t sVar3;
  float *pfVar4;
  char *pcVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  word_doc_frequency *pwVar11;
  reference pvVar12;
  pointer pwVar13;
  int __c;
  int __c_00;
  dense_iterator<float> *rhs;
  ulong *in_RDI;
  float fVar14;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_vector<word_doc_frequency>_>_>::value,_pair<iterator,_bool>_>
  _Var15;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  co_feature_df;
  mapped_type *co_feature;
  uint64_t f2_1;
  uint64_t f1_1;
  feature_pair *pairs;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  float coherence;
  size_t topic_1;
  float avg_coherence;
  float epsilon;
  size_t j_1;
  size_t i_3;
  value_type *examples_for_f2;
  word_doc_frequency *wdf_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *__range2_1;
  value_type *examples_for_f1;
  pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  *pair;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  *__range1_1;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> vec_1;
  iterator wdf;
  uint64_t f2;
  uint64_t f1;
  feature_pair *wp;
  iterator __end2;
  iterator __begin2;
  vector<feature_pair,_std::allocator<feature_pair>_> *__range2;
  vector<feature_pair,_std::allocator<feature_pair>_> *vec;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  *__range1;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  coWordsDFSet;
  size_t j;
  size_t i_2;
  value_type *word_pairs;
  int i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> top_features_idx;
  iterator v;
  uint64_t i;
  iterator iter;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
  top_features;
  anon_class_1_0_00000001 cmp;
  size_t topic;
  int top_words_count;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  topics_word_pairs;
  uint64_t length;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  float in_stack_fffffffffffffbc4;
  pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  *in_stack_fffffffffffffbc8;
  dense_parameters *in_stack_fffffffffffffbd0;
  anon_class_8_1_3fcf654a_for__M_pred in_stack_fffffffffffffbd8;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  in_stack_fffffffffffffbe0;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  in_stack_fffffffffffffbe8;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
  *in_stack_fffffffffffffbf0;
  ulong uVar16;
  undefined6 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbfe;
  undefined1 in_stack_fffffffffffffbff;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
  in_stack_fffffffffffffc00;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_330;
  dense_parameters *local_328;
  uint64_t local_320;
  size_type local_318;
  reference local_310;
  feature_pair *local_308;
  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
  local_300;
  reference local_2f8;
  float local_2ec;
  ulong local_2e8;
  float local_2e0;
  float local_2dc;
  word_doc_frequency *local_2d8;
  ulong local_2d0;
  reference local_2c8;
  reference local_2c0;
  word_doc_frequency *local_2b8;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_2b0;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *local_2a8;
  reference local_2a0;
  reference local_298;
  _Self local_290;
  _Self local_288;
  undefined1 *local_280;
  _Base_ptr local_278;
  undefined1 local_270;
  uint64_t local_240;
  undefined4 local_238;
  uint64_t *local_230;
  undefined8 local_228;
  uint64_t local_208;
  undefined4 local_200;
  word_doc_frequency *local_1f8;
  uint64_t *local_1f0;
  word_doc_frequency *local_1e8;
  word_doc_frequency *local_1e0;
  word_doc_frequency *local_1d8;
  _Self local_1d0;
  _Self local_1c8;
  uint64_t local_1c0;
  uint64_t local_1b8;
  reference local_1b0;
  feature_pair *local_1a8;
  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
  local_1a0;
  reference local_198;
  reference local_190;
  vector<feature_pair,_std::allocator<feature_pair>_> *local_188;
  __normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
  local_180;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  *local_178;
  undefined1 local_170 [48];
  feature_pair local_140;
  ulong local_130;
  ulong local_128;
  reference local_120;
  int local_114;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  feature local_f8;
  dense_iterator<float> local_e8;
  dense_iterator<float> local_d0;
  feature local_b8;
  ulong local_a8;
  dense_iterator<float> local_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_48;
  int local_40;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  local_30;
  char *local_18;
  ulong *local_8;
  
  local_18 = (char *)(1L << (*(byte *)(in_RDI[0x31] + 0x50) & 0x3f));
  local_8 = in_RDI;
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::vector((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
            *)0x228bce);
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::resize((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
            *)in_stack_fffffffffffffbe0._M_current,(size_type)in_stack_fffffffffffffbd8.f2);
  local_40 = 10;
  for (local_48 = 0; local_48 < *local_8; local_48 = local_48 + 1) {
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    std::vector<feature,_std::allocator<feature>_>::vector
              ((vector<feature,_std::allocator<feature>_> *)0x228c44);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
    ::priority_queue(in_stack_fffffffffffffbf0,
                     (anon_class_1_0_00000001 *)in_stack_fffffffffffffbe8._M_current,
                     (vector<feature,_std::allocator<feature>_> *)
                     in_stack_fffffffffffffbe0._M_current);
    std::vector<feature,_std::allocator<feature>_>::~vector
              ((vector<feature,_std::allocator<feature>_> *)in_stack_fffffffffffffbd0);
    dense_parameters::begin(in_stack_fffffffffffffbd0);
    local_a8 = 0;
    while (uVar16 = local_a8, pcVar5 = local_18, sVar3 = min((long)local_40,(size_t)local_18),
          uVar16 < sVar3) {
      pfVar4 = dense_iterator<float>::operator*(&local_a0);
      fVar14 = pfVar4[local_48];
      pcVar5 = dense_iterator<float>::index(&local_a0,pcVar5,__c);
      feature::feature(&local_b8,fVar14,(uint64_t)pcVar5);
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
              *)in_stack_fffffffffffffbe0._M_current,(value_type *)in_stack_fffffffffffffbd8.f2);
      local_a8 = local_a8 + 1;
      dense_iterator<float>::operator++(&local_a0);
    }
    dense_parameters::begin(in_stack_fffffffffffffbd0);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffbd0);
      rhs = &local_e8;
      bVar2 = dense_iterator<float>::operator!=(&local_d0,rhs);
      if (!bVar2) break;
      pfVar4 = dense_iterator<float>::operator*(&local_d0);
      fVar14 = pfVar4[local_48];
      pvVar7 = std::
               priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
               ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                      *)0x228e34);
      if (pvVar7->x <= fVar14 && fVar14 != pvVar7->x) {
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
               *)in_stack_fffffffffffffbd0);
        pfVar4 = dense_iterator<float>::operator*(&local_d0);
        fVar14 = pfVar4[local_48];
        pcVar5 = dense_iterator<float>::index(&local_d0,(char *)rhs,__c_00);
        feature::feature(&local_f8,fVar14,(uint64_t)pcVar5);
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                *)in_stack_fffffffffffffbe0._M_current,(value_type *)in_stack_fffffffffffffbd8.f2);
      }
      dense_iterator<float>::operator++(&local_d0);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x228ef0);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
    ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
            *)0x228efd);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffbe0._M_current,(size_type)in_stack_fffffffffffffbd8.f2);
    sVar6 = std::
            priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
            ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                    *)0x228f2b);
    local_114 = (int)sVar6;
    while (local_114 = local_114 + -1, -1 < local_114) {
      pvVar7 = std::
               priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
               ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                      *)0x228f62);
      uVar1 = pvVar7->weight_index;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_110,(long)local_114);
      *pvVar8 = uVar1;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
             *)in_stack_fffffffffffffbd0);
    }
    local_120 = std::
                vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                ::operator[](&local_30,local_48);
    for (local_128 = 0; uVar16 = local_128,
        sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_110),
        sVar10 = local_128, uVar16 < sVar9; local_128 = local_128 + 1) {
      while( true ) {
        local_130 = sVar10 + 1;
        uVar16 = local_130;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_110);
        if (sVar10 <= uVar16) break;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_110,local_128);
        uVar1 = *pvVar8;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_110,local_130);
        feature_pair::feature_pair(&local_140,uVar1,*pvVar8);
        std::vector<feature_pair,_std::allocator<feature_pair>_>::push_back
                  ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                   CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   (value_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        sVar10 = local_130;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbd0);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
    ::~priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                       *)0x22914b);
  }
  std::
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
         *)0x229183);
  local_178 = &local_30;
  local_180._M_current =
       (vector<feature_pair,_std::allocator<feature_pair>_> *)
       std::
       vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
       ::begin((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  local_188 = (vector<feature_pair,_std::allocator<feature_pair>_> *)
              std::
              vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
              ::end((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                            (__normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)), bVar2
        ) {
    local_198 = __gnu_cxx::
                __normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
                ::operator*(&local_180);
    local_190 = local_198;
    local_1a0._M_current =
         (feature_pair *)
         std::vector<feature_pair,_std::allocator<feature_pair>_>::begin
                   ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                    CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_1a8 = (feature_pair *)
                std::vector<feature_pair,_std::allocator<feature_pair>_>::end
                          ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                           CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                              (__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
          bVar2) {
      local_1b0 = __gnu_cxx::
                  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                  ::operator*(&local_1a0);
      local_1b8 = local_1b0->f1;
      local_1c0 = local_1b0->f2;
      local_1c8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
           ::find((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                  (key_type *)0x229299);
      local_1d0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
           ::end((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      bVar2 = std::operator!=(&local_1c8,&local_1d0);
      if (bVar2) {
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        local_1e0 = (word_doc_frequency *)
                    std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::begin
                              ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        local_1e8 = (word_doc_frequency *)
                    std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                              ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        local_1f0 = &local_1c0;
        local_1d8 = (word_doc_frequency *)
                    std::
                    find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,compute_coherence_metrics<dense_parameters>(lda&,dense_parameters&)::_lambda(word_doc_frequency_const&)_1_>
                              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                               in_stack_fffffffffffffbd8);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        local_1f8 = (word_doc_frequency *)
                    std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                              ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           (__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        if (bVar2) {
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
          local_208 = local_1c0;
          local_200 = 0;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::push_back
                    ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     (value_type *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        }
      }
      else {
        local_240 = local_1c0;
        local_238 = 0;
        local_230 = &local_240;
        local_228 = 1;
        std::allocator<word_doc_frequency>::allocator((allocator<word_doc_frequency> *)0x229448);
        __l._M_array._6_1_ = in_stack_fffffffffffffbfe;
        __l._M_array._0_6_ = in_stack_fffffffffffffbf8;
        __l._M_array._7_1_ = in_stack_fffffffffffffbff;
        __l._M_len = (size_type)in_stack_fffffffffffffc00._M_node;
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   in_stack_fffffffffffffbf0,__l,
                   (allocator_type *)in_stack_fffffffffffffbe8._M_current);
        std::allocator<word_doc_frequency>::~allocator((allocator<word_doc_frequency> *)0x229479);
        std::
        make_pair<unsigned_long&,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>&>
                  (&in_stack_fffffffffffffbc8->first,
                   (vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        _Var15 = std::
                 map<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
                 ::
                 insert<std::pair<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>
                           ((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                             *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        in_stack_fffffffffffffc00 = _Var15.first._M_node;
        in_stack_fffffffffffffbff = _Var15.second;
        local_278 = in_stack_fffffffffffffc00._M_node;
        local_270 = in_stack_fffffffffffffbff;
        std::
        pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>::
        ~pair((pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
               *)0x2294dd);
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::~vector
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   in_stack_fffffffffffffbd0);
      }
      __gnu_cxx::
      __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>::
      operator++(&local_1a0);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
    ::operator++(&local_180);
  }
  local_280 = local_170;
  local_288._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
       ::begin((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  local_290._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
       ::end((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  while (bVar2 = std::operator!=(&local_288,&local_290), bVar2) {
    local_298 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                             *)0x2295e8);
    local_2a0 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(local_8 + 0x2c),local_298->first);
    local_2a8 = &local_298->second;
    local_2b0._M_current =
         (word_doc_frequency *)
         std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::begin
                   ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                    CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_2b8 = (word_doc_frequency *)
                std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                          ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                           CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                              (__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
          bVar2) {
      local_2c0 = __gnu_cxx::
                  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                  ::operator*(&local_2b0);
      local_2c8 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)(local_8 + 0x2c),local_2c0->idx);
      local_2d0 = 0;
      local_2d8 = (word_doc_frequency *)0x0;
      while( true ) {
        uVar16 = local_2d0;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_2a0);
        in_stack_fffffffffffffbfe = false;
        if (uVar16 < sVar10) {
          in_stack_fffffffffffffbe8._M_current = local_2d8;
          pwVar11 = (word_doc_frequency *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_2c8);
          in_stack_fffffffffffffbfe = in_stack_fffffffffffffbe8._M_current < pwVar11;
        }
        if ((bool)in_stack_fffffffffffffbfe == false) break;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_2a0,local_2d0);
        in_stack_fffffffffffffbe0._M_current = (word_doc_frequency *)*pvVar8;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_2c8,(size_type)local_2d8);
        if (in_stack_fffffffffffffbe0._M_current == (word_doc_frequency *)*pvVar8) {
          local_2c0->count = local_2c0->count + 1;
          local_2d0 = local_2d0 + 1;
          local_2d8 = (word_doc_frequency *)((long)&local_2d8->idx + 1);
        }
        else {
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_2c8,(size_type)local_2d8);
          in_stack_fffffffffffffbd8.f2 = (uint64_t *)*pvVar8;
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_2a0,local_2d0);
          if (in_stack_fffffffffffffbd8.f2 < (value_type *)*pvVar8) {
            local_2d8 = (word_doc_frequency *)((long)&local_2d8->idx + 1);
          }
          else {
            local_2d0 = local_2d0 + 1;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
      ::operator++(&local_2b0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  }
  local_2dc = 1e-06;
  local_2e0 = 0.0;
  for (local_2e8 = 0; local_2e8 < *local_8; local_2e8 = local_2e8 + 1) {
    local_2ec = 0.0;
    local_2f8 = std::
                vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                ::operator[](&local_30,local_2e8);
    local_300._M_current =
         (feature_pair *)
         std::vector<feature_pair,_std::allocator<feature_pair>_>::begin
                   ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                    CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    local_308 = (feature_pair *)
                std::vector<feature_pair,_std::allocator<feature_pair>_>::end
                          ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                           CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                              (__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
          bVar2) {
      local_310 = __gnu_cxx::
                  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                  ::operator*(&local_300);
      local_318 = local_310->f1;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_8 + 0x29),
                           local_318);
      if (*pvVar12 != 0) {
        local_320 = local_310->f2;
        in_stack_fffffffffffffbd0 =
             (dense_parameters *)
             std::
             map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
             ::operator[]((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                           *)in_stack_fffffffffffffc00._M_node,
                          (key_type *)
                          CONCAT17(in_stack_fffffffffffffbff,
                                   CONCAT16(in_stack_fffffffffffffbfe,in_stack_fffffffffffffbf8)));
        local_328 = in_stack_fffffffffffffbd0;
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::begin
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        local_330 = std::
                    find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,compute_coherence_metrics<dense_parameters>(lda&,dense_parameters&)::_lambda(word_doc_frequency_const&)_2_>
                              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                               (anon_class_8_1_3fcf654a_for__M_pred)in_stack_fffffffffffffbd8.f2);
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           (__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        if (bVar2) {
          pwVar13 = __gnu_cxx::
                    __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                    ::operator->(&local_330);
          in_stack_fffffffffffffbc4 = (float)pwVar13->count + local_2dc;
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (local_8 + 0x29),local_318);
          fVar14 = logf(in_stack_fffffffffffffbc4 / (float)*pvVar12);
          local_2ec = fVar14 + local_2ec;
        }
      }
      __gnu_cxx::
      __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>::
      operator++(&local_300);
    }
    printf("Topic %3d coherence: %f\n",SUB84((double)local_2ec,0),local_2e8 & 0xffffffff);
    local_2e0 = local_2ec + local_2e0;
  }
  local_2e0 = local_2e0 / (float)*local_8;
  printf("Avg topic coherence: %f\n",SUB84((double)local_2e0,0));
  std::
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  ::~map((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
          *)0x229b7a);
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::~vector((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
             *)in_stack_fffffffffffffbd0);
  return;
}

Assistant:

void compute_coherence_metrics(lda &l, T &weights)
{
  uint64_t length = (uint64_t)1 << l.all->num_bits;

  std::vector<std::vector<feature_pair>> topics_word_pairs;
  topics_word_pairs.resize(l.topics);

  int top_words_count = 10;  // parameterize and check

  for (size_t topic = 0; topic < l.topics; topic++)
  {
    // get top features for this topic
    auto cmp = [](feature &left, feature &right) { return left.x > right.x; };
    std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
    typename T::iterator iter = weights.begin();
    for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
      top_features.push(feature((&(*iter))[topic], iter.index()));

    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if ((&(*v))[topic] > top_features.top().x)
      {
        top_features.pop();
        top_features.push(feature((&(*v))[topic], v.index()));
      }

    // extract idx and sort descending
    vector<uint64_t> top_features_idx;
    top_features_idx.resize(top_features.size());
    for (int i = (int)top_features.size() - 1; i >= 0; i--)
    {
      top_features_idx[i] = top_features.top().weight_index;
      top_features.pop();
    }

    auto &word_pairs = topics_word_pairs[topic];
    for (size_t i = 0; i < top_features_idx.size(); i++)
      for (size_t j = i + 1; j < top_features_idx.size(); j++)
        word_pairs.push_back(feature_pair(top_features_idx[i], top_features_idx[j]));
  }

  // compress word pairs and create record for storing frequency
  std::map<uint64_t, std::vector<word_doc_frequency>> coWordsDFSet;
  for (auto &vec : topics_word_pairs)
  {
    for (auto &wp : vec)
    {
      auto f1 = wp.f1;
      auto f2 = wp.f2;
      auto wdf = coWordsDFSet.find(f1);

      if (wdf != coWordsDFSet.end())
      {
        // http://stackoverflow.com/questions/5377434/does-stdmapiterator-return-a-copy-of-value-or-a-value-itself
        // if (wdf->second.find(f2) == wdf->second.end())

        if (std::find_if(wdf->second.begin(), wdf->second.end(),
                [&f2](const word_doc_frequency &v) { return v.idx == f2; }) != wdf->second.end())
        {
          wdf->second.push_back({f2, 0});
          // printf(" add %d %d\n", f1, f2);
        }
      }
      else
      {
        std::vector<word_doc_frequency> vec = {{f2, 0}};
        coWordsDFSet.insert(std::make_pair(f1, vec));
        // printf(" insert %d %d\n", f1, f2);
      }
    }
  }

  // this.GetWordPairsDocumentFrequency(coWordsDFSet);
  for (auto &pair : coWordsDFSet)
  {
    auto &examples_for_f1 = l.feature_to_example_map[pair.first];
    for (auto &wdf : pair.second)
    {
      auto &examples_for_f2 = l.feature_to_example_map[wdf.idx];

      // assumes examples_for_f1 and examples_for_f2 are orderd
      size_t i = 0;
      size_t j = 0;
      while (i < examples_for_f1.size() && j < examples_for_f2.size())
      {
        if (examples_for_f1[i] == examples_for_f2[j])
        {
          wdf.count++;
          i++;
          j++;
        }
        else if (examples_for_f2[j] < examples_for_f1[i])
          j++;
        else
          i++;
      }
    }
  }

  float epsilon = 1e-6f;  // TODO
  float avg_coherence = 0;
  for (size_t topic = 0; topic < l.topics; topic++)
  {
    float coherence = 0;

    for (auto &pairs : topics_word_pairs[topic])
    {
      auto f1 = pairs.f1;
      if (l.feature_counts[f1] == 0)
        continue;

      auto f2 = pairs.f2;
      auto &co_feature = coWordsDFSet[f1];
      auto co_feature_df = std::find_if(
          co_feature.begin(), co_feature.end(), [&f2](const word_doc_frequency &v) { return v.idx == f2; });

      if (co_feature_df != co_feature.end())
      {
        // printf("(%d:%d + eps)/(%d:%d)\n", f2, co_feature_df->count, f1, l.feature_counts[f1]);
        coherence += logf((co_feature_df->count + epsilon) / l.feature_counts[f1]);
      }
    }

    printf("Topic %3d coherence: %f\n", (int)topic, coherence);

    // TODO: expose per topic coherence

    // TODO: good vs. bad topics
    avg_coherence += coherence;
  }

  avg_coherence /= l.topics;

  printf("Avg topic coherence: %f\n", avg_coherence);
}